

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins_tests.cpp
# Opt level: O2

void __thiscall
coins_tests::FlushTest::TestFlushBehavior
          (FlushTest *this,CCoinsViewCacheTest *view,CCoinsViewDB *base,
          vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
          *all_caches,bool do_erasing_flush)

{
  FastRandomContext *this_00;
  CCoinsMap *map;
  __uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
  _Var1;
  bool bVar2;
  readonly_property<bool> rVar3;
  byte bVar4;
  undefined1 uVar5;
  int iVar6;
  undefined7 in_register_00000081;
  iterator pvVar7;
  iterator in_R9;
  iterator pvVar8;
  size_t *psVar9;
  CAmount *pCVar10;
  char *pcVar11;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  const_string msg_36;
  const_string msg_37;
  const_string msg_38;
  const_string msg_39;
  const_string msg_40;
  const_string msg_41;
  const_string msg_42;
  const_string msg_43;
  const_string msg_44;
  const_string msg_45;
  const_string msg_46;
  const_string msg_47;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  const_string file_35;
  const_string file_36;
  const_string file_37;
  const_string file_38;
  const_string file_39;
  const_string file_40;
  const_string file_41;
  const_string file_42;
  const_string file_43;
  const_string file_44;
  const_string file_45;
  const_string file_46;
  const_string file_47;
  check_type cVar14;
  assertion_result *paVar12;
  assertion_result *ar;
  undefined1 *puVar13;
  char *local_aa0;
  char *local_a98;
  undefined1 *local_a90;
  undefined1 *local_a88;
  char *local_a80;
  char *local_a78;
  char *local_a70;
  char *local_a68;
  undefined1 *local_a60;
  undefined1 *local_a58;
  char *local_a50;
  char *local_a48;
  char *local_a40;
  char *local_a38;
  undefined1 *local_a30;
  undefined1 *local_a28;
  char *local_a20;
  char *local_a18;
  char *local_a10;
  char *local_a08;
  undefined1 *local_a00;
  undefined1 *local_9f8;
  char *local_9f0;
  char *local_9e8;
  char *local_9e0;
  char *local_9d8;
  undefined1 *local_9d0;
  undefined1 *local_9c8;
  char *local_9c0;
  char *local_9b8;
  char *local_9b0;
  char *local_9a8;
  undefined1 *local_9a0;
  undefined1 *local_998;
  char *local_990;
  char *local_988;
  char *local_980;
  char *local_978;
  undefined1 *local_970;
  undefined1 *local_968;
  char *local_960;
  char *local_958;
  char *local_950;
  char *local_948;
  undefined1 *local_940;
  undefined1 *local_938;
  char *local_930;
  char *local_928;
  char *local_920;
  char *local_918;
  undefined1 *local_910;
  undefined1 *local_908;
  char *local_900;
  char *local_8f8;
  char *local_8f0;
  char *local_8e8;
  undefined1 *local_8e0;
  undefined1 *local_8d8;
  char *local_8d0;
  char *local_8c8;
  char *local_8c0;
  char *local_8b8;
  undefined1 *local_8b0;
  undefined1 *local_8a8;
  char *local_8a0;
  char *local_898;
  char *local_890;
  char *local_888;
  undefined1 *local_880;
  undefined1 *local_878;
  char *local_870;
  char *local_868;
  char *local_860;
  char *local_858;
  undefined1 *local_850;
  undefined1 *local_848;
  char *local_840;
  char *local_838;
  char *local_830;
  char *local_828;
  undefined1 *local_820;
  undefined1 *local_818;
  char *local_810;
  char *local_808;
  char *local_800;
  char *local_7f8;
  undefined1 *local_7f0;
  undefined1 *local_7e8;
  char *local_7e0;
  char *local_7d8;
  char *local_7d0;
  char *local_7c8;
  undefined1 *local_7c0;
  undefined1 *local_7b8;
  char *local_7b0;
  char *local_7a8;
  char *local_7a0;
  char *local_798;
  undefined1 *local_790;
  undefined1 *local_788;
  char *local_780;
  char *local_778;
  char *local_770;
  char *local_768;
  undefined1 *local_760;
  undefined1 *local_758;
  char *local_750;
  char *local_748;
  char *local_740;
  char *local_738;
  undefined1 *local_730;
  undefined1 *local_728;
  char *local_720;
  char *local_718;
  char *local_710;
  char *local_708;
  undefined1 *local_700;
  undefined1 *local_6f8;
  char *local_6f0;
  char *local_6e8;
  char *local_6e0;
  char *local_6d8;
  undefined1 *local_6d0;
  undefined1 *local_6c8;
  char *local_6c0;
  char *local_6b8;
  char *local_6b0;
  char *local_6a8;
  undefined1 *local_6a0;
  undefined1 *local_698;
  char *local_690;
  char *local_688;
  char *local_680;
  char *local_678;
  undefined1 *local_670;
  undefined1 *local_668;
  char *local_660;
  char *local_658;
  char *local_650;
  char *local_648;
  undefined1 *local_640;
  undefined1 *local_638;
  char *local_630;
  char *local_628;
  char *local_620;
  char *local_618;
  undefined1 *local_610;
  undefined1 *local_608;
  char *local_600;
  char *local_5f8;
  char *local_5f0;
  char *local_5e8;
  undefined1 *local_5e0;
  undefined1 *local_5d8;
  char *local_5d0;
  char *local_5c8;
  char *local_5c0;
  char *local_5b8;
  undefined1 *local_5b0;
  undefined1 *local_5a8;
  char *local_5a0;
  char *local_598;
  char *local_590;
  char *local_588;
  undefined1 *local_580;
  undefined1 *local_578;
  char *local_570;
  char *local_568;
  char *local_560;
  char *local_558;
  undefined1 *local_550;
  undefined1 *local_548;
  char *local_540;
  char *local_538;
  char *local_500;
  char *local_4f8;
  undefined1 *local_4f0;
  undefined1 *local_4e8;
  char *local_4e0;
  char *local_4d8;
  undefined1 *local_4d0;
  undefined1 *local_4c8;
  char *local_4c0;
  char *local_4b8;
  char *local_4b0;
  char *local_4a8;
  undefined1 *local_4a0;
  undefined1 *local_498;
  char *local_490;
  char *local_488;
  char *local_480;
  char *local_478;
  undefined1 *local_470;
  undefined1 *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  undefined1 *local_440;
  undefined1 *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  undefined1 *local_410;
  undefined1 *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  undefined1 *local_3e0;
  undefined1 *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  CAmount coin_val;
  char *local_3a8;
  undefined1 *local_3a0;
  undefined1 *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  undefined1 *local_370;
  undefined1 *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  undefined1 *local_340;
  undefined1 *local_338;
  char *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  undefined1 *local_310;
  undefined1 *local_308;
  char *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  undefined1 *local_2e0;
  undefined1 *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  undefined1 *local_280;
  undefined1 *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
  local_160;
  assertion_result local_150;
  undefined1 *local_138;
  undefined1 *local_130;
  char *local_128;
  char *local_120;
  anon_class_16_2_c349ca0a flush_all;
  size_t cache_size;
  size_t cache_usage;
  char flags;
  CAmount value;
  undefined1 local_e8 [24];
  char *pcStack_d0;
  Coin coin;
  undefined1 local_88 [24];
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
  *pbStack_70;
  uint32_t local_68;
  undefined1 local_58 [24];
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
  *pbStack_40;
  long local_38;
  
  pvVar7 = (iterator)CONCAT71(in_register_00000081,do_erasing_flush);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &(this->super_BasicTestingSetup).m_rng;
  flush_all.this = this;
  flush_all.all_caches = all_caches;
  RandomMixin<FastRandomContext>::rand256
            ((uint256 *)local_58,&this_00->super_RandomMixin<FastRandomContext>);
  local_88._16_8_ = local_58._16_8_;
  pbStack_70 = pbStack_40;
  local_88._0_8_ = local_58._0_8_;
  local_88._8_8_ = local_58._8_8_;
  local_68 = 0;
  MakeCoin(&coin,this);
  local_128 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_120 = "";
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = pvVar7;
  file.m_end = (iterator)0x3b4;
  file.m_begin = (iterator)&local_128;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_138,msg);
  bVar2 = CCoinsViewDB::HaveCoin(base,(COutPoint *)local_88);
  local_150.m_message.px = (element_type *)0x0;
  local_150.m_message.pn.pi_ = (sp_counted_base *)0x0;
  pcStack_d0 = (char *)&local_160;
  local_160.m_lhs.m_value = 0xb69541;
  local_160.m_rhs = (unsigned_long *)0xb69555;
  local_e8[8] = false;
  local_e8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_e8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_170 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_168 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_150.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar2;
  boost::test_tools::tt_detail::report_assertion
            (&local_150,(lazy_ostream *)local_e8,1,0,WARN,_cVar14,(size_t)&local_170,0x3b4);
  boost::detail::shared_count::~shared_count(&local_150.m_message.pn);
  local_180 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_178 = "";
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar8;
  msg_00.m_begin = pvVar7;
  file_00.m_end = (iterator)0x3b5;
  file_00.m_begin = (iterator)&local_180;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_190,
             msg_00);
  iVar6 = (*(view->super_CCoinsViewCache).super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView
            [1])(view,local_88);
  local_150.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((byte)iVar6 ^ 1);
  local_150.m_message.px = (element_type *)0x0;
  local_150.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_160.m_lhs.m_value = 0xb69556;
  local_160.m_rhs = (unsigned_long *)0xb6956b;
  local_e8[8] = false;
  local_e8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_e8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pcStack_d0 = (char *)&local_160;
  local_1a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_198 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_150,(lazy_ostream *)local_e8,1,0,WARN,_cVar14,(size_t)&local_1a0,0x3b5);
  boost::detail::shared_count::~shared_count(&local_150.m_message.pn);
  Coin::Coin((Coin *)local_e8,&coin);
  CCoinsViewCache::AddCoin
            (&view->super_CCoinsViewCache,(COutPoint *)local_88,(Coin *)local_e8,false);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)(local_e8 + 8));
  cache_usage = CCoinsViewCache::DynamicMemoryUsage(&view->super_CCoinsViewCache);
  cache_size = (view->super_CCoinsViewCache).cacheCoins._M_h._M_element_count;
  local_1b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_1a8 = "";
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar8;
  msg_01.m_begin = pvVar7;
  file_01.m_end = (iterator)0x3bf;
  file_01.m_begin = (iterator)&local_1b0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1c0,
             msg_01);
  bVar2 = CCoinsViewDB::HaveCoin(base,(COutPoint *)local_88);
  local_150.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_150.m_message.px = (element_type *)0x0;
  local_150.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_160.m_lhs.m_value = 0xb69541;
  local_160.m_rhs = (unsigned_long *)0xb69555;
  local_e8[8] = false;
  local_e8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_e8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pcStack_d0 = (char *)&local_160;
  local_1d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_1c8 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_150,(lazy_ostream *)local_e8,1,0,WARN,_cVar14,(size_t)&local_1d0,0x3bf);
  boost::detail::shared_count::~shared_count(&local_150.m_message.pn);
  local_1e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_1d8 = "";
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = pvVar8;
  msg_02.m_begin = pvVar7;
  file_02.m_end = (iterator)0x3c0;
  file_02.m_begin = (iterator)&local_1e0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1f0,
             msg_02);
  iVar6 = (*(view->super_CCoinsViewCache).super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView
            [1])(view,local_88);
  paVar12 = &local_150;
  local_150.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)SUB41(iVar6,0);
  local_150.m_message.px = (element_type *)0x0;
  local_150.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_160.m_lhs.m_value = (long)"!view->HaveCoin(outp)" + 1;
  local_160.m_rhs = (unsigned_long *)0xb6956b;
  local_e8[8] = false;
  local_e8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_e8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pcStack_d0 = (char *)&local_160;
  local_200 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_1f8 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (paVar12,(lazy_ostream *)local_e8,1,0,WARN,_cVar14,(size_t)&local_200,0x3c0);
  map = &(view->super_CCoinsViewCache).cacheCoins;
  boost::detail::shared_count::~shared_count(&local_150.m_message.pn);
  GetCoinsMapEntry(map,&value,&flags,(COutPoint *)local_88);
  local_210 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_208 = "";
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = pvVar8;
  msg_03.m_begin = pvVar7;
  file_03.m_end = (iterator)0x3c3;
  file_03.m_begin = (iterator)&local_210;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_220,
             msg_03);
  local_e8[8] = false;
  local_e8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_e8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pcStack_d0 = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_230 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_228 = "";
  pvVar7 = (iterator)0x2;
  pCVar10 = &value;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (local_e8,&local_230,0x3c3,1,2,pCVar10,"value",&coin,"coin.out.nValue");
  local_240 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_238 = "";
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = (iterator)pCVar10;
  msg_04.m_begin = pvVar7;
  file_04.m_end = (iterator)0x3c4;
  file_04.m_begin = (iterator)&local_240;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_250,
             msg_04);
  local_e8[8] = false;
  local_e8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_e8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pcStack_d0 = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_260 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_258 = "";
  local_150._0_4_ = 3;
  pvVar7 = (iterator)0x2;
  pcVar11 = &flags;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char,int>
            (local_e8,&local_260,0x3c4,1,2,pcVar11,"flags",paVar12,"DIRTY|FRESH");
  TestFlushBehavior::anon_class_16_2_c349ca0a::operator()(&flush_all,false);
  local_270 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_268 = "";
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = pcVar11;
  msg_05.m_begin = pvVar7;
  file_05.m_end = (iterator)0x3cb;
  file_05.m_begin = (iterator)&local_270;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_280,
             msg_05);
  local_e8[8] = false;
  local_e8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_e8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pcStack_d0 = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_290 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_288 = "";
  local_150._0_8_ = CCoinsViewCache::DynamicMemoryUsage(&view->super_CCoinsViewCache);
  pvVar7 = (iterator)0x2;
  psVar9 = &cache_usage;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (local_e8,&local_290,0x3cb,1,2,psVar9,"cache_usage",paVar12,"view->DynamicMemoryUsage()"
            );
  local_2a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_298 = "";
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = (iterator)psVar9;
  msg_06.m_begin = pvVar7;
  file_06.m_end = (iterator)0x3cc;
  file_06.m_begin = (iterator)&local_2a0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_2b0,
             msg_06);
  local_e8[8] = false;
  local_e8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_e8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pcStack_d0 = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_2c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_2b8 = "";
  local_150._0_8_ = (view->super_CCoinsViewCache).cacheCoins._M_h._M_element_count;
  pvVar7 = (iterator)0x2;
  psVar9 = &cache_size;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (local_e8,&local_2c0,0x3cc,1,2,psVar9,"cache_size",paVar12,"view->map().size()");
  GetCoinsMapEntry(map,&value,&flags,(COutPoint *)local_88);
  local_2d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_2c8 = "";
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_07.m_end = (iterator)psVar9;
  msg_07.m_begin = pvVar7;
  file_07.m_end = (iterator)0x3d1;
  file_07.m_begin = (iterator)&local_2d0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_2e0,
             msg_07);
  local_e8[8] = false;
  local_e8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_e8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pcStack_d0 = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_2f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_2e8 = "";
  pvVar7 = (iterator)0x2;
  pCVar10 = &value;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (local_e8,&local_2f0,0x3d1,1,2,pCVar10,"value",&coin,"coin.out.nValue");
  local_300 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_2f8 = "";
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_08.m_end = (iterator)pCVar10;
  msg_08.m_begin = pvVar7;
  file_08.m_end = (iterator)0x3d2;
  file_08.m_begin = (iterator)&local_300;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_310,
             msg_08);
  local_e8[8] = false;
  local_e8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_e8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pcStack_d0 = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_320 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_318 = "";
  local_150._0_8_ = local_150._0_8_ & 0xffffffff00000000;
  pvVar7 = (iterator)0x2;
  pcVar11 = &flags;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char,int>
            (local_e8,&local_320,0x3d2,1,2,pcVar11,"flags",paVar12,"0");
  local_330 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_328 = "";
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_09.m_end = pcVar11;
  msg_09.m_begin = pvVar7;
  file_09.m_end = (iterator)0x3d5;
  file_09.m_begin = (iterator)&local_330;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_340,
             msg_09);
  rVar3.super_class_property<bool>.value =
       (class_property<bool>)CCoinsViewDB::HaveCoin(base,(COutPoint *)local_88);
  local_150.m_message.px = (element_type *)0x0;
  local_150.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_160.m_lhs.m_value = (long)"!base.HaveCoin(outp)" + 1;
  local_160.m_rhs = (unsigned_long *)0xb69555;
  local_e8[8] = false;
  local_e8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_e8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pcStack_d0 = (char *)&local_160;
  local_350 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_348 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_150.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar3.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            (&local_150,(lazy_ostream *)local_e8,1,0,WARN,(check_type)paVar12,(size_t)&local_350,
             0x3d5);
  boost::detail::shared_count::~shared_count(&local_150.m_message.pn);
  local_360 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_358 = "";
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_10.m_end = pvVar8;
  msg_10.m_begin = pvVar7;
  file_10.m_end = (iterator)0x3d6;
  file_10.m_begin = (iterator)&local_360;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_370,
             msg_10);
  iVar6 = (*(view->super_CCoinsViewCache).super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView
            [1])(view,local_88);
  local_150.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(char)iVar6;
  local_150.m_message.px = (element_type *)0x0;
  local_150.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_160.m_lhs.m_value = (long)"!view->HaveCoin(outp)" + 1;
  local_160.m_rhs = (unsigned_long *)0xb6956b;
  local_e8[8] = false;
  local_e8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_e8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pcStack_d0 = (char *)&local_160;
  local_380 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_378 = "";
  pvVar7 = &DAT_00000001;
  pcVar11 = (char *)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_150,(lazy_ostream *)local_e8,1,0,WARN,(check_type)paVar12,(size_t)&local_380,
             0x3d6);
  boost::detail::shared_count::~shared_count(&local_150.m_message.pn);
  ar = paVar12;
  if (do_erasing_flush) {
    TestFlushBehavior::anon_class_16_2_c349ca0a::operator()(&flush_all,true);
    local_390 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
    ;
    local_388 = "";
    local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_398 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_11.m_end = pcVar11;
    msg_11.m_begin = pvVar7;
    file_11.m_end = (iterator)0x3de;
    file_11.m_begin = (iterator)&local_390;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_3a0,
               msg_11);
    local_160.m_lhs.m_value = CCoinsViewCache::DynamicMemoryUsage(&view->super_CCoinsViewCache);
    local_160.m_rhs = &cache_usage;
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
    ::evaluate(&local_150,&local_160,false);
    coin_val = (CAmount)anon_var_dwarf_4a37b7;
    local_3a8 = "";
    local_e8[8] = false;
    local_e8._0_8_ = &PTR__lazy_ostream_0113a070;
    local_e8._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_3c0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
    ;
    local_3b8 = "";
    pvVar7 = &DAT_00000001;
    pvVar8 = (iterator)0xe;
    pcStack_d0 = (char *)&coin_val;
    boost::test_tools::tt_detail::report_assertion
              (&local_150,(lazy_ostream *)local_e8,1,0xe,WARN,(check_type)paVar12,(size_t)&local_3c0
               ,0x3de);
    boost::detail::shared_count::~shared_count(&local_150.m_message.pn);
    local_3d0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
    ;
    local_3c8 = "";
    local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_12.m_end = pvVar8;
    msg_12.m_begin = pvVar7;
    file_12.m_end = (iterator)0x3e0;
    file_12.m_begin = (iterator)&local_3d0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_3e0,
               msg_12);
    local_160.m_lhs.m_value = (view->super_CCoinsViewCache).cacheCoins._M_h._M_element_count;
    local_160.m_rhs = &cache_size;
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_unsigned_long_&,_boost::test_tools::assertion::op::LT<unsigned_long,_unsigned_long,_void>_>
    ::evaluate(&local_150,
               (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_unsigned_long_&,_boost::test_tools::assertion::op::LT<unsigned_long,_unsigned_long,_void>_>
                *)&local_160,false);
    coin_val = (CAmount)anon_var_dwarf_4a37c4;
    local_3a8 = "";
    local_e8[8] = false;
    local_e8._0_8_ = &PTR__lazy_ostream_0113a070;
    local_e8._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_3f0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
    ;
    local_3e8 = "";
    ar = &local_150;
    pvVar7 = &DAT_00000001;
    pvVar8 = (iterator)0xe;
    pcStack_d0 = (char *)&coin_val;
    boost::test_tools::tt_detail::report_assertion
              (ar,(lazy_ostream *)local_e8,1,0xe,WARN,(check_type)paVar12,(size_t)&local_3f0,0x3e0);
    boost::detail::shared_count::~shared_count(&local_150.m_message.pn);
    GetCoinsMapEntry(map,&value,&flags,(COutPoint *)local_88);
    local_400 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
    ;
    local_3f8 = "";
    local_410 = &boost::unit_test::basic_cstring<char_const>::null;
    local_408 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_13.m_end = pvVar8;
    msg_13.m_begin = pvVar7;
    file_13.m_end = (iterator)0x3e5;
    file_13.m_begin = (iterator)&local_400;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_410,
               msg_13);
    local_e8[8] = false;
    local_e8._0_8_ = &PTR__lazy_ostream_01139f30;
    local_e8._16_8_ = boost::unit_test::lazy_ostream::inst;
    pcStack_d0 = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
    local_420 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
    ;
    local_418 = "";
    pvVar7 = (iterator)0x2;
    pCVar10 = &value;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_e8,&local_420,0x3e5,1,2,pCVar10,"value",&ABSENT,"ABSENT");
    local_430 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
    ;
    local_428 = "";
    local_440 = &boost::unit_test::basic_cstring<char_const>::null;
    local_438 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_14.m_end = (iterator)pCVar10;
    msg_14.m_begin = pvVar7;
    file_14.m_end = (iterator)0x3e6;
    file_14.m_begin = (iterator)&local_430;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_440,
               msg_14);
    local_e8[8] = false;
    local_e8._0_8_ = &PTR__lazy_ostream_01139f30;
    local_e8._16_8_ = boost::unit_test::lazy_ostream::inst;
    pcStack_d0 = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
    local_450 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
    ;
    local_448 = "";
    pvVar7 = (iterator)0x2;
    pcVar11 = &flags;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char,char>
              (local_e8,&local_450,0x3e6,1,2,pcVar11,"flags",&NO_ENTRY,"NO_ENTRY");
    CCoinsViewCache::AccessCoin(&view->super_CCoinsViewCache,(COutPoint *)local_88);
    GetCoinsMapEntry(map,&value,&flags,(COutPoint *)local_88);
    local_460 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
    ;
    local_458 = "";
    local_470 = &boost::unit_test::basic_cstring<char_const>::null;
    local_468 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_15.m_end = pcVar11;
    msg_15.m_begin = pvVar7;
    file_15.m_end = (iterator)0x3ea;
    file_15.m_begin = (iterator)&local_460;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_470,
               msg_15);
    local_e8[8] = false;
    local_e8._0_8_ = &PTR__lazy_ostream_01139f30;
    local_e8._16_8_ = boost::unit_test::lazy_ostream::inst;
    pcStack_d0 = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
    local_480 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
    ;
    local_478 = "";
    pvVar7 = (iterator)0x2;
    pCVar10 = &value;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_e8,&local_480,0x3ea,1,2,pCVar10,"value",&coin,"coin.out.nValue");
    local_490 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
    ;
    local_488 = "";
    local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_498 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_16.m_end = (iterator)pCVar10;
    msg_16.m_begin = pvVar7;
    file_16.m_end = (iterator)0x3eb;
    file_16.m_begin = (iterator)&local_490;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_4a0,
               msg_16);
    local_e8[8] = false;
    local_e8._0_8_ = &PTR__lazy_ostream_01139f30;
    local_e8._16_8_ = boost::unit_test::lazy_ostream::inst;
    pcStack_d0 = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
    local_4b0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
    ;
    local_4a8 = "";
    local_150._0_8_ = local_150._0_8_ & 0xffffffff00000000;
    pvVar7 = (iterator)0x2;
    pcVar11 = &flags;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char,int>
              (local_e8,&local_4b0,0x3eb,1,2,pcVar11,"flags",ar,"0");
  }
  local_4c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_4b8 = "";
  local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_17.m_end = pcVar11;
  msg_17.m_begin = pvVar7;
  file_17.m_end = (iterator)0x3f2;
  file_17.m_begin = (iterator)&local_4c0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_4d0,
             msg_17);
  Coin::Coin((Coin *)local_e8,&coin);
  CCoinsViewCache::AddCoin
            (&view->super_CCoinsViewCache,(COutPoint *)local_88,(Coin *)local_e8,false);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)(local_e8 + 8));
  local_4e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_4d8 = "";
  local_4f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_18.m_end = pcVar11;
  msg_18.m_begin = pvVar7;
  file_18.m_end = (iterator)0x3f2;
  file_18.m_begin = (iterator)&local_4e0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_4f0,
             msg_18);
  local_150._0_8_ = local_150._0_8_ & 0xffffffffffffff00;
  local_150.m_message.px = (element_type *)0x0;
  local_150.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8[8] = false;
  local_e8._0_8_ = &PTR__lazy_ostream_0113ae90;
  local_e8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pcStack_d0 = "exception std::logic_error expected but not raised";
  local_500 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_4f8 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            (&local_150,(lazy_ostream *)local_e8,1,1,WARN,(check_type)ar,(size_t)&local_500,0x3f2);
  boost::detail::shared_count::~shared_count(&local_150.m_message.pn);
  local_540 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_538 = "";
  local_550 = &boost::unit_test::basic_cstring<char_const>::null;
  local_548 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_19.m_end = pvVar8;
  msg_19.m_begin = pvVar7;
  file_19.m_end = (iterator)0x3f6;
  file_19.m_begin = (iterator)&local_540;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_550,
             msg_19);
  rVar3.super_class_property<bool>.value =
       (class_property<bool>)
       CCoinsViewCache::SpendCoin(&view->super_CCoinsViewCache,(COutPoint *)local_88,(Coin *)0x0);
  local_150.m_message.px = (element_type *)0x0;
  local_150.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_160.m_lhs.m_value = (long)"!view->SpendCoin(outp)" + 1;
  local_160.m_rhs = (unsigned_long *)0xb69686;
  local_e8[8] = false;
  local_e8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_e8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pcStack_d0 = (char *)&local_160;
  local_560 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_558 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_150.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar3.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            (&local_150,(lazy_ostream *)local_e8,1,0,WARN,(check_type)ar,(size_t)&local_560,0x3f6);
  boost::detail::shared_count::~shared_count(&local_150.m_message.pn);
  GetCoinsMapEntry(map,&value,&flags,(COutPoint *)local_88);
  local_570 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_568 = "";
  local_580 = &boost::unit_test::basic_cstring<char_const>::null;
  local_578 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_20.m_end = pvVar8;
  msg_20.m_begin = pvVar7;
  file_20.m_end = (iterator)0x3fa;
  file_20.m_begin = (iterator)&local_570;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_580,
             msg_20);
  local_e8[8] = false;
  local_e8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_e8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pcStack_d0 = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_590 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_588 = "";
  pvVar7 = (iterator)0x2;
  pCVar10 = &value;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (local_e8,&local_590,0x3fa,1,2,pCVar10,"value",&SPENT,"SPENT");
  local_5a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_598 = "";
  local_5b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5a8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_21.m_end = (iterator)pCVar10;
  msg_21.m_begin = pvVar7;
  file_21.m_end = (iterator)0x3fb;
  file_21.m_begin = (iterator)&local_5a0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_5b0,
             msg_21);
  local_e8[8] = false;
  local_e8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_e8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pcStack_d0 = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_5c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_5b8 = "";
  puVar13 = &DIRTY;
  pvVar7 = (iterator)0x2;
  pcVar11 = &flags;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char,char>
            (local_e8,&local_5c0,0x3fb,1,2,pcVar11,"flags",&DIRTY,"DIRTY");
  local_5d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_5c8 = "";
  local_5e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5d8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_22.m_end = pcVar11;
  msg_22.m_begin = pvVar7;
  file_22.m_end = (iterator)0x3fc;
  file_22.m_begin = (iterator)&local_5d0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_5e0,
             msg_22);
  iVar6 = (*(view->super_CCoinsViewCache).super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView
            [1])(view,local_88);
  local_150.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((byte)iVar6 ^ 1);
  local_150.m_message.px = (element_type *)0x0;
  local_150.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_160.m_lhs.m_value = 0xb69556;
  local_160.m_rhs = (unsigned_long *)0xb6956b;
  local_e8[8] = false;
  local_e8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_e8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pcStack_d0 = (char *)&local_160;
  local_5f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_5e8 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_150,(lazy_ostream *)local_e8,1,0,WARN,(check_type)puVar13,(size_t)&local_5f0,
             0x3fc);
  boost::detail::shared_count::~shared_count(&local_150.m_message.pn);
  local_600 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_5f8 = "";
  local_610 = &boost::unit_test::basic_cstring<char_const>::null;
  local_608 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_23.m_end = pvVar8;
  msg_23.m_begin = pvVar7;
  file_23.m_end = (iterator)0x3fd;
  file_23.m_begin = (iterator)&local_600;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_610,
             msg_23);
  local_150.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)CCoinsViewDB::HaveCoin(base,(COutPoint *)local_88);
  local_150.m_message.px = (element_type *)0x0;
  local_150.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_160.m_lhs.m_value = (long)"!base.HaveCoin(outp)" + 1;
  local_160.m_rhs = (unsigned_long *)0xb69555;
  local_e8[8] = false;
  local_e8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_e8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pcStack_d0 = (char *)&local_160;
  local_620 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_618 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_150,(lazy_ostream *)local_e8,1,0,WARN,(check_type)puVar13,(size_t)&local_620,
             0x3fd);
  boost::detail::shared_count::~shared_count(&local_150.m_message.pn);
  TestFlushBehavior::anon_class_16_2_c349ca0a::operator()(&flush_all,false);
  local_630 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_628 = "";
  local_640 = &boost::unit_test::basic_cstring<char_const>::null;
  local_638 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_24.m_end = pvVar8;
  msg_24.m_begin = pvVar7;
  file_24.m_end = (iterator)0x402;
  file_24.m_begin = (iterator)&local_630;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_640,
             msg_24);
  iVar6 = (*(view->super_CCoinsViewCache).super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView
            [1])(view,local_88);
  local_150.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((byte)iVar6 ^ 1);
  local_150.m_message.px = (element_type *)0x0;
  local_150.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_160.m_lhs.m_value = 0xb69556;
  local_160.m_rhs = (unsigned_long *)0xb6956b;
  local_e8[8] = false;
  local_e8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_e8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pcStack_d0 = (char *)&local_160;
  local_650 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_648 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_150,(lazy_ostream *)local_e8,1,0,WARN,(check_type)puVar13,(size_t)&local_650,
             0x402);
  boost::detail::shared_count::~shared_count(&local_150.m_message.pn);
  local_660 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_658 = "";
  local_670 = &boost::unit_test::basic_cstring<char_const>::null;
  local_668 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_25.m_end = pvVar8;
  msg_25.m_begin = pvVar7;
  file_25.m_end = (iterator)0x403;
  file_25.m_begin = (iterator)&local_660;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_670,
             msg_25);
  bVar2 = CCoinsViewDB::HaveCoin(base,(COutPoint *)local_88);
  local_150.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_150.m_message.px = (element_type *)0x0;
  local_150.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_160.m_lhs.m_value = 0xb69541;
  local_160.m_rhs = (unsigned_long *)0xb69555;
  local_e8[8] = false;
  local_e8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_e8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pcStack_d0 = (char *)&local_160;
  local_680 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_678 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_150,(lazy_ostream *)local_e8,1,0,WARN,(check_type)puVar13,(size_t)&local_680,
             0x403);
  boost::detail::shared_count::~shared_count(&local_150.m_message.pn);
  local_690 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_688 = "";
  local_6a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_698 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_26.m_end = pvVar8;
  msg_26.m_begin = pvVar7;
  file_26.m_end = (iterator)0x406;
  file_26.m_begin = (iterator)&local_690;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_6a0,
             msg_26);
  bVar2 = CCoinsViewCache::SpendCoin(&view->super_CCoinsViewCache,(COutPoint *)local_88,(Coin *)0x0)
  ;
  local_150.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_150.m_message.px = (element_type *)0x0;
  local_150.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_160.m_lhs.m_value = 0xb69670;
  local_160.m_rhs = (unsigned_long *)0xb69686;
  local_e8[8] = false;
  local_e8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_e8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pcStack_d0 = (char *)&local_160;
  local_6b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_6a8 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_150,(lazy_ostream *)local_e8,1,0,WARN,(check_type)puVar13,(size_t)&local_6b0,
             0x406);
  boost::detail::shared_count::~shared_count(&local_150.m_message.pn);
  RandomMixin<FastRandomContext>::rand256
            ((uint256 *)local_e8,&this_00->super_RandomMixin<FastRandomContext>);
  local_88._9_7_ = local_e8._9_7_;
  local_88[8] = local_e8[8];
  local_58._16_8_ = local_e8._16_8_;
  pbStack_40 = (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
                *)pcStack_d0;
  local_58._0_8_ = local_e8._0_8_;
  local_88._0_8_ = local_e8._0_8_;
  local_88._16_8_ = local_e8._16_8_;
  pbStack_70 = (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
                *)pcStack_d0;
  local_68 = 0;
  local_58._8_8_ = local_88._8_8_;
  MakeCoin((Coin *)local_e8,this);
  Coin::operator=(&coin,(Coin *)local_e8);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)(local_e8 + 8));
  local_6c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_6b8 = "";
  local_6d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6c8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_27.m_end = pvVar8;
  msg_27.m_begin = pvVar7;
  file_27.m_end = (iterator)0x40e;
  file_27.m_begin = (iterator)&local_6c0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_6d0,
             msg_27);
  bVar2 = CCoinsViewDB::HaveCoin(base,(COutPoint *)local_88);
  local_150.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_150.m_message.px = (element_type *)0x0;
  local_150.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_160.m_lhs.m_value = 0xb69541;
  local_160.m_rhs = (unsigned_long *)0xb69555;
  local_e8[8] = false;
  local_e8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_e8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pcStack_d0 = (char *)&local_160;
  local_6e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_6d8 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_150,(lazy_ostream *)local_e8,1,0,WARN,(check_type)puVar13,(size_t)&local_6e0,
             0x40e);
  boost::detail::shared_count::~shared_count(&local_150.m_message.pn);
  local_6f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_6e8 = "";
  local_700 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6f8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_28.m_end = pvVar8;
  msg_28.m_begin = pvVar7;
  file_28.m_end = (iterator)0x40f;
  file_28.m_begin = (iterator)&local_6f0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_700,
             msg_28);
  _Var1._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
  .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>._M_head_impl =
       (((all_caches->
         super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start)->_M_t).
       super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
       ._M_t;
  bVar4 = (**(code **)(*(long *)_Var1._M_t.
                                super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                                .
                                super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>
                                ._M_head_impl + 8))
                    (_Var1._M_t.
                     super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                     .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                     _M_head_impl,local_88);
  local_150.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(bVar4 ^ 1);
  local_150.m_message.px = (element_type *)0x0;
  local_150.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_160.m_lhs.m_value = 0xb69687;
  local_160.m_rhs = (unsigned_long *)0xb696a5;
  local_e8[8] = false;
  local_e8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_e8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pcStack_d0 = (char *)&local_160;
  local_710 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_708 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_150,(lazy_ostream *)local_e8,1,0,WARN,(check_type)puVar13,(size_t)&local_710,
             0x40f);
  boost::detail::shared_count::~shared_count(&local_150.m_message.pn);
  local_720 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_718 = "";
  local_730 = &boost::unit_test::basic_cstring<char_const>::null;
  local_728 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_29.m_end = pvVar8;
  msg_29.m_begin = pvVar7;
  file_29.m_end = (iterator)0x410;
  file_29.m_begin = (iterator)&local_720;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_730,
             msg_29);
  _Var1._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
  .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>._M_head_impl =
       (all_caches->
       super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start[1]._M_t.
       super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
       ._M_t;
  bVar4 = (**(code **)(*(long *)_Var1._M_t.
                                super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                                .
                                super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>
                                ._M_head_impl + 8))
                    (_Var1._M_t.
                     super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                     .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                     _M_head_impl,local_88);
  local_150.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(bVar4 ^ 1);
  local_150.m_message.px = (element_type *)0x0;
  local_150.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_160.m_lhs.m_value = 0xb696a6;
  local_160.m_rhs = (unsigned_long *)0xb696c4;
  local_e8[8] = false;
  local_e8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_e8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pcStack_d0 = (char *)&local_160;
  local_740 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_738 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_150,(lazy_ostream *)local_e8,1,0,WARN,(check_type)puVar13,(size_t)&local_740,
             0x410);
  boost::detail::shared_count::~shared_count(&local_150.m_message.pn);
  CCoinsViewCache::AddCoin
            ((CCoinsViewCache *)
             (((all_caches->
               super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start)->_M_t).
             super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
             ._M_t,(COutPoint *)local_88,&coin,false);
  CCoinsViewCache::Sync
            ((CCoinsViewCache *)
             (((all_caches->
               super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start)->_M_t).
             super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
             ._M_t);
  local_750 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_748 = "";
  local_760 = &boost::unit_test::basic_cstring<char_const>::null;
  local_758 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_30.m_end = pvVar8;
  msg_30.m_begin = pvVar7;
  file_30.m_end = (iterator)0x414;
  file_30.m_begin = (iterator)&local_750;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_760,
             msg_30);
  local_150.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)CCoinsViewDB::HaveCoin(base,(COutPoint *)local_88);
  local_150.m_message.px = (element_type *)0x0;
  local_150.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_160.m_lhs.m_value = (long)"!base.HaveCoin(outp)" + 1;
  local_160.m_rhs = (unsigned_long *)0xb69555;
  local_e8[8] = false;
  local_e8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_e8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pcStack_d0 = (char *)&local_160;
  local_770 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_768 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_150,(lazy_ostream *)local_e8,1,0,WARN,(check_type)puVar13,(size_t)&local_770,
             0x414);
  boost::detail::shared_count::~shared_count(&local_150.m_message.pn);
  local_780 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_778 = "";
  local_790 = &boost::unit_test::basic_cstring<char_const>::null;
  local_788 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_31.m_end = pvVar8;
  msg_31.m_begin = pvVar7;
  file_31.m_end = (iterator)0x415;
  file_31.m_begin = (iterator)&local_780;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,(size_t)&local_790,
             msg_31);
  _Var1._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
  .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>._M_head_impl =
       (((all_caches->
         super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start)->_M_t).
       super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
       ._M_t;
  local_150.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (**(code **)(*(long *)_Var1._M_t.
                             super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                             .
                             super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>
                             ._M_head_impl + 8))
                 (_Var1._M_t.
                  super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                  .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                  _M_head_impl,local_88);
  local_150.m_message.px = (element_type *)0x0;
  local_150.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_160.m_lhs.m_value = (long)"!all_caches[0]->HaveCoin(outp)" + 1;
  local_160.m_rhs = (unsigned_long *)0xb696a5;
  local_e8[8] = false;
  local_e8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_e8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pcStack_d0 = (char *)&local_160;
  local_7a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_798 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_150,(lazy_ostream *)local_e8,1,0,WARN,(check_type)puVar13,(size_t)&local_7a0,
             0x415);
  boost::detail::shared_count::~shared_count(&local_150.m_message.pn);
  local_7b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_7a8 = "";
  local_7c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7b8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_32.m_end = pvVar8;
  msg_32.m_begin = pvVar7;
  file_32.m_end = (iterator)0x416;
  file_32.m_begin = (iterator)&local_7b0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,(size_t)&local_7c0,
             msg_32);
  bVar2 = CCoinsViewCache::HaveCoinInCache
                    ((CCoinsViewCache *)
                     (all_caches->
                     super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[1]._M_t.
                     super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                     ._M_t,(COutPoint *)local_88);
  local_150.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_150.m_message.px = (element_type *)0x0;
  local_150.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_160.m_lhs.m_value = 0xb696c5;
  local_160.m_rhs = (unsigned_long *)0xb696ea;
  local_e8[8] = false;
  local_e8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_e8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pcStack_d0 = (char *)&local_160;
  local_7d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_7c8 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_150,(lazy_ostream *)local_e8,1,0,WARN,(check_type)puVar13,(size_t)&local_7d0,
             0x416);
  boost::detail::shared_count::~shared_count(&local_150.m_message.pn);
  local_7e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_7d8 = "";
  local_7f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7e8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_33.m_end = pvVar8;
  msg_33.m_begin = pvVar7;
  file_33.m_end = (iterator)0x418;
  file_33.m_begin = (iterator)&local_7e0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,(size_t)&local_7f0,
             msg_33);
  local_150.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       CCoinsViewCache::SpendCoin
                 ((CCoinsViewCache *)
                  (all_caches->
                  super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start[1]._M_t.
                  super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                  ._M_t,(COutPoint *)local_88,(Coin *)0x0);
  local_150.m_message.px = (element_type *)0x0;
  local_150.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_160.m_lhs.m_value = 0xb696eb;
  local_160.m_rhs = (unsigned_long *)0xb69709;
  local_e8[8] = false;
  local_e8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_e8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pcStack_d0 = (char *)&local_160;
  local_800 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_7f8 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_150,(lazy_ostream *)local_e8,1,0,WARN,(check_type)puVar13,(size_t)&local_800,
             0x418);
  boost::detail::shared_count::~shared_count(&local_150.m_message.pn);
  TestFlushBehavior::anon_class_16_2_c349ca0a::operator()(&flush_all,false);
  local_810 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_808 = "";
  local_820 = &boost::unit_test::basic_cstring<char_const>::null;
  local_818 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_34.m_end = pvVar8;
  msg_34.m_begin = pvVar7;
  file_34.m_end = (iterator)0x41a;
  file_34.m_begin = (iterator)&local_810;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,(size_t)&local_820,
             msg_34);
  bVar2 = CCoinsViewDB::HaveCoin(base,(COutPoint *)local_88);
  local_150.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_150.m_message.px = (element_type *)0x0;
  local_150.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_160.m_lhs.m_value = 0xb69541;
  local_160.m_rhs = (unsigned_long *)0xb69555;
  local_e8[8] = false;
  local_e8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_e8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pcStack_d0 = (char *)&local_160;
  local_830 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_828 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_150,(lazy_ostream *)local_e8,1,0,WARN,(check_type)puVar13,(size_t)&local_830,
             0x41a);
  boost::detail::shared_count::~shared_count(&local_150.m_message.pn);
  local_840 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_838 = "";
  local_850 = &boost::unit_test::basic_cstring<char_const>::null;
  local_848 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_35.m_end = pvVar8;
  msg_35.m_begin = pvVar7;
  file_35.m_end = (iterator)0x41b;
  file_35.m_begin = (iterator)&local_840;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_35,(size_t)&local_850,
             msg_35);
  _Var1._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
  .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>._M_head_impl =
       (((all_caches->
         super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start)->_M_t).
       super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
       ._M_t;
  bVar4 = (**(code **)(*(long *)_Var1._M_t.
                                super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                                .
                                super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>
                                ._M_head_impl + 8))
                    (_Var1._M_t.
                     super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                     .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                     _M_head_impl,local_88);
  local_150.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(bVar4 ^ 1);
  local_150.m_message.px = (element_type *)0x0;
  local_150.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_160.m_lhs.m_value = 0xb69687;
  local_160.m_rhs = (unsigned_long *)0xb696a5;
  local_e8[8] = false;
  local_e8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_e8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pcStack_d0 = (char *)&local_160;
  local_860 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_858 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_150,(lazy_ostream *)local_e8,1,0,WARN,(check_type)puVar13,(size_t)&local_860,
             0x41b);
  boost::detail::shared_count::~shared_count(&local_150.m_message.pn);
  local_870 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_868 = "";
  local_880 = &boost::unit_test::basic_cstring<char_const>::null;
  local_878 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_36.m_end = pvVar8;
  msg_36.m_begin = pvVar7;
  file_36.m_end = (iterator)0x41c;
  file_36.m_begin = (iterator)&local_870;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_36,(size_t)&local_880,
             msg_36);
  _Var1._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
  .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>._M_head_impl =
       (all_caches->
       super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start[1]._M_t.
       super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
       ._M_t;
  bVar4 = (**(code **)(*(long *)_Var1._M_t.
                                super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                                .
                                super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>
                                ._M_head_impl + 8))
                    (_Var1._M_t.
                     super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                     .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                     _M_head_impl,local_88);
  local_150.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(bVar4 ^ 1);
  local_150.m_message.px = (element_type *)0x0;
  local_150.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_160.m_lhs.m_value = 0xb696a6;
  local_160.m_rhs = (unsigned_long *)0xb696c4;
  local_e8[8] = false;
  local_e8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_e8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pcStack_d0 = (char *)&local_160;
  local_890 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_888 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_150,(lazy_ostream *)local_e8,1,0,WARN,(check_type)puVar13,(size_t)&local_890,
             0x41c);
  boost::detail::shared_count::~shared_count(&local_150.m_message.pn);
  TestFlushBehavior::anon_class_16_2_c349ca0a::operator()(&flush_all,true);
  RandomMixin<FastRandomContext>::rand256
            ((uint256 *)local_e8,&this_00->super_RandomMixin<FastRandomContext>);
  local_88._9_7_ = local_e8._9_7_;
  local_88[8] = local_e8[8];
  local_58._16_8_ = local_e8._16_8_;
  pbStack_40 = (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
                *)pcStack_d0;
  local_58._0_8_ = local_e8._0_8_;
  local_88._0_8_ = local_e8._0_8_;
  local_88._16_8_ = local_e8._16_8_;
  pbStack_70 = (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
                *)pcStack_d0;
  local_68 = 0;
  local_58._8_8_ = local_88._8_8_;
  MakeCoin((Coin *)local_e8,this);
  Coin::operator=(&coin,(Coin *)local_e8);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)(local_e8 + 8));
  coin_val = coin.out.nValue;
  local_8a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_898 = "";
  local_8b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8a8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_37.m_end = pvVar8;
  msg_37.m_begin = pvVar7;
  file_37.m_end = (iterator)0x426;
  file_37.m_begin = (iterator)&local_8a0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_37,(size_t)&local_8b0,
             msg_37);
  bVar2 = CCoinsViewDB::HaveCoin(base,(COutPoint *)local_88);
  local_150.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_150.m_message.px = (element_type *)0x0;
  local_150.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_160.m_lhs.m_value = 0xb69541;
  local_160.m_rhs = (unsigned_long *)0xb69555;
  local_e8[8] = false;
  local_e8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_e8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pcStack_d0 = (char *)&local_160;
  local_8c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_8b8 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_150,(lazy_ostream *)local_e8,1,0,WARN,(check_type)puVar13,(size_t)&local_8c0,
             0x426);
  boost::detail::shared_count::~shared_count(&local_150.m_message.pn);
  local_8d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_8c8 = "";
  local_8e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8d8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_38.m_end = pvVar8;
  msg_38.m_begin = pvVar7;
  file_38.m_end = (iterator)0x427;
  file_38.m_begin = (iterator)&local_8d0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_38,(size_t)&local_8e0,
             msg_38);
  _Var1._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
  .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>._M_head_impl =
       (((all_caches->
         super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start)->_M_t).
       super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
       ._M_t;
  bVar4 = (**(code **)(*(long *)_Var1._M_t.
                                super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                                .
                                super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>
                                ._M_head_impl + 8))
                    (_Var1._M_t.
                     super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                     .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                     _M_head_impl,local_88);
  local_150.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(bVar4 ^ 1);
  local_150.m_message.px = (element_type *)0x0;
  local_150.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_160.m_lhs.m_value = 0xb69687;
  local_160.m_rhs = (unsigned_long *)0xb696a5;
  local_e8[8] = false;
  local_e8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_e8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pcStack_d0 = (char *)&local_160;
  local_8f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_8e8 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_150,(lazy_ostream *)local_e8,1,0,WARN,(check_type)puVar13,(size_t)&local_8f0,
             0x427);
  boost::detail::shared_count::~shared_count(&local_150.m_message.pn);
  local_900 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_8f8 = "";
  local_910 = &boost::unit_test::basic_cstring<char_const>::null;
  local_908 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_39.m_end = pvVar8;
  msg_39.m_begin = pvVar7;
  file_39.m_end = (iterator)0x428;
  file_39.m_begin = (iterator)&local_900;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_39,(size_t)&local_910,
             msg_39);
  _Var1._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
  .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>._M_head_impl =
       (all_caches->
       super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start[1]._M_t.
       super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
       ._M_t;
  uVar5 = (**(code **)(*(long *)_Var1._M_t.
                                super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                                .
                                super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>
                                ._M_head_impl + 8))
                    (_Var1._M_t.
                     super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                     .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                     _M_head_impl,local_88);
  paVar12 = &local_150;
  local_150._0_8_ = CONCAT71(local_150._1_7_,uVar5) ^ 1;
  local_150.m_message.px = (element_type *)0x0;
  local_150.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_160.m_lhs.m_value = 0xb696a6;
  local_160.m_rhs = (unsigned_long *)0xb696c4;
  local_e8[8] = false;
  local_e8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_e8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pcStack_d0 = (char *)&local_160;
  local_920 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_918 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (paVar12,(lazy_ostream *)local_e8,1,0,WARN,(check_type)puVar13,(size_t)&local_920,0x428)
  ;
  boost::detail::shared_count::~shared_count(&local_150.m_message.pn);
  CCoinsViewCache::AddCoin
            ((CCoinsViewCache *)
             (((all_caches->
               super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start)->_M_t).
             super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
             ._M_t,(COutPoint *)local_88,&coin,false);
  GetCoinsMapEntry((CCoinsMap *)
                   ((long)(((all_caches->
                            super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start)->_M_t).
                          super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                          ._M_t + 0x170),&value,&flags,(COutPoint *)local_88);
  local_930 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_928 = "";
  local_940 = &boost::unit_test::basic_cstring<char_const>::null;
  local_938 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_40.m_end = pvVar8;
  msg_40.m_begin = pvVar7;
  file_40.m_end = (iterator)0x42f;
  file_40.m_begin = (iterator)&local_930;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_40,(size_t)&local_940,
             msg_40);
  local_e8[8] = false;
  local_e8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_e8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pcStack_d0 = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_950 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_948 = "";
  pvVar7 = (iterator)0x2;
  pCVar10 = &value;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (local_e8,&local_950,0x42f,1,2,pCVar10,"value",&coin_val,"coin_val");
  local_960 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_958 = "";
  local_970 = &boost::unit_test::basic_cstring<char_const>::null;
  local_968 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_41.m_end = (iterator)pCVar10;
  msg_41.m_begin = pvVar7;
  file_41.m_end = (iterator)0x430;
  file_41.m_begin = (iterator)&local_960;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_41,(size_t)&local_970,
             msg_41);
  local_e8[8] = false;
  local_e8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_e8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pcStack_d0 = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_980 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_978 = "";
  local_150._0_4_ = 3;
  pvVar7 = (iterator)0x2;
  pcVar11 = &flags;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char,int>
            (local_e8,&local_980,0x430,1,2,pcVar11,"flags",paVar12,"DIRTY|FRESH");
  local_990 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_988 = "";
  local_9a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_998 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_42.m_end = pcVar11;
  msg_42.m_begin = pvVar7;
  file_42.m_end = (iterator)0x433;
  file_42.m_begin = (iterator)&local_990;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_42,(size_t)&local_9a0,
             msg_42);
  bVar2 = CCoinsViewDB::HaveCoin(base,(COutPoint *)local_88);
  local_150.m_message.px = (element_type *)0x0;
  local_150.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_160.m_lhs.m_value = 0xb69541;
  local_160.m_rhs = (unsigned_long *)0xb69555;
  local_e8[8] = false;
  local_e8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_e8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pcStack_d0 = (char *)&local_160;
  local_9b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_9a8 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_150.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar2;
  boost::test_tools::tt_detail::report_assertion
            (&local_150,(lazy_ostream *)local_e8,1,0,WARN,(check_type)paVar12,(size_t)&local_9b0,
             0x433);
  boost::detail::shared_count::~shared_count(&local_150.m_message.pn);
  local_9c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_9b8 = "";
  local_9d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9c8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_43.m_end = pvVar8;
  msg_43.m_begin = pvVar7;
  file_43.m_end = (iterator)0x435;
  file_43.m_begin = (iterator)&local_9c0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_43,(size_t)&local_9d0,
             msg_43);
  local_150.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       CCoinsViewCache::SpendCoin
                 ((CCoinsViewCache *)
                  (((all_caches->
                    super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start)->_M_t).
                  super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                  ._M_t,(COutPoint *)local_88,(Coin *)0x0);
  local_150.m_message.px = (element_type *)0x0;
  local_150.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_160.m_lhs.m_value = 0xb69713;
  local_160.m_rhs = (unsigned_long *)0xb69731;
  local_e8[8] = false;
  local_e8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_e8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pcStack_d0 = (char *)&local_160;
  local_9e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_9d8 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_150,(lazy_ostream *)local_e8,1,0,WARN,(check_type)paVar12,(size_t)&local_9e0,
             0x435);
  boost::detail::shared_count::~shared_count(&local_150.m_message.pn);
  CCoinsViewCache::Sync
            ((CCoinsViewCache *)
             (((all_caches->
               super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start)->_M_t).
             super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
             ._M_t);
  GetCoinsMapEntry((CCoinsMap *)
                   ((long)(((all_caches->
                            super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start)->_M_t).
                          super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                          ._M_t + 0x170),&value,&flags,(COutPoint *)local_88);
  local_9f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_9e8 = "";
  local_a00 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9f8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_44.m_end = pvVar8;
  msg_44.m_begin = pvVar7;
  file_44.m_end = (iterator)0x43a;
  file_44.m_begin = (iterator)&local_9f0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_44,(size_t)&local_a00,
             msg_44);
  local_e8[8] = false;
  local_e8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_e8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pcStack_d0 = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_a10 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_a08 = "";
  pvVar7 = (iterator)0x2;
  pCVar10 = &value;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (local_e8,&local_a10,0x43a,1,2,pCVar10,"value",&ABSENT,"ABSENT");
  local_a20 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_a18 = "";
  local_a30 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a28 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_45.m_end = (iterator)pCVar10;
  msg_45.m_begin = pvVar7;
  file_45.m_end = (iterator)0x43b;
  file_45.m_begin = (iterator)&local_a20;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_45,(size_t)&local_a30,
             msg_45);
  local_e8[8] = false;
  local_e8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_e8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pcStack_d0 = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_a40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_a38 = "";
  puVar13 = &NO_ENTRY;
  pvVar7 = (iterator)0x2;
  pcVar11 = &flags;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char,char>
            (local_e8,&local_a40,0x43b,1,2,pcVar11,"flags",&NO_ENTRY,"NO_ENTRY");
  local_a50 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_a48 = "";
  local_a60 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a58 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_46.m_end = pcVar11;
  msg_46.m_begin = pvVar7;
  file_46.m_end = (iterator)0x43c;
  file_46.m_begin = (iterator)&local_a50;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_46,(size_t)&local_a60,
             msg_46);
  bVar2 = CCoinsViewCache::HaveCoinInCache
                    ((CCoinsViewCache *)
                     (((all_caches->
                       super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start)->_M_t).
                     super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                     ._M_t,(COutPoint *)local_88);
  local_150.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_150.m_message.px = (element_type *)0x0;
  local_150.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_160.m_lhs.m_value = 0xb69732;
  local_160.m_rhs = (unsigned_long *)0xb69757;
  local_e8[8] = false;
  local_e8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_e8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pcStack_d0 = (char *)&local_160;
  local_a70 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_a68 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_150,(lazy_ostream *)local_e8,1,0,WARN,(check_type)puVar13,(size_t)&local_a70,
             0x43c);
  boost::detail::shared_count::~shared_count(&local_150.m_message.pn);
  local_a80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_a78 = "";
  local_a90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a88 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_47.m_end = pvVar8;
  msg_47.m_begin = pvVar7;
  file_47.m_end = (iterator)0x43d;
  file_47.m_begin = (iterator)&local_a80;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_47,(size_t)&local_a90,
             msg_47);
  bVar2 = CCoinsViewDB::HaveCoin(base,(COutPoint *)local_88);
  local_150.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar2;
  local_150.m_message.px = (element_type *)0x0;
  local_150.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_160.m_lhs.m_value = 0xb69541;
  local_160.m_rhs = (unsigned_long *)0xb69555;
  local_e8[8] = false;
  local_e8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_e8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pcStack_d0 = (char *)&local_160;
  local_aa0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_a98 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_150,(lazy_ostream *)local_e8,1,0,WARN,(check_type)puVar13,(size_t)&local_aa0,
             0x43d);
  boost::detail::shared_count::~shared_count(&local_150.m_message.pn);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            (&coin.out.scriptPubKey.super_CScriptBase);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TestFlushBehavior(
    CCoinsViewCacheTest* view,
    CCoinsViewDB& base,
    std::vector<std::unique_ptr<CCoinsViewCacheTest>>& all_caches,
    bool do_erasing_flush)
{
    CAmount value;
    char flags;
    size_t cache_usage;
    size_t cache_size;

    auto flush_all = [this, &all_caches](bool erase) {
        // Flush in reverse order to ensure that flushes happen from children up.
        for (auto i = all_caches.rbegin(); i != all_caches.rend(); ++i) {
            auto& cache = *i;
            cache->SanityCheck();
            // hashBlock must be filled before flushing to disk; value is
            // unimportant here. This is normally done during connect/disconnect block.
            cache->SetBestBlock(m_rng.rand256());
            erase ? cache->Flush() : cache->Sync();
        }
    };

    Txid txid = Txid::FromUint256(m_rng.rand256());
    COutPoint outp = COutPoint(txid, 0);
    Coin coin = MakeCoin();
    // Ensure the coins views haven't seen this coin before.
    BOOST_CHECK(!base.HaveCoin(outp));
    BOOST_CHECK(!view->HaveCoin(outp));

    // --- 1. Adding a random coin to the child cache
    //
    view->AddCoin(outp, Coin(coin), false);

    cache_usage = view->DynamicMemoryUsage();
    cache_size = view->map().size();

    // `base` shouldn't have coin (no flush yet) but `view` should have cached it.
    BOOST_CHECK(!base.HaveCoin(outp));
    BOOST_CHECK(view->HaveCoin(outp));

    GetCoinsMapEntry(view->map(), value, flags, outp);
    BOOST_CHECK_EQUAL(value, coin.out.nValue);
    BOOST_CHECK_EQUAL(flags, DIRTY|FRESH);

    // --- 2. Flushing all caches (without erasing)
    //
    flush_all(/*erase=*/ false);

    // CoinsMap usage should be unchanged since we didn't erase anything.
    BOOST_CHECK_EQUAL(cache_usage, view->DynamicMemoryUsage());
    BOOST_CHECK_EQUAL(cache_size, view->map().size());

    // --- 3. Ensuring the entry still exists in the cache and has been written to parent
    //
    GetCoinsMapEntry(view->map(), value, flags, outp);
    BOOST_CHECK_EQUAL(value, coin.out.nValue);
    BOOST_CHECK_EQUAL(flags, 0);  // Flags should have been wiped.

    // Both views should now have the coin.
    BOOST_CHECK(base.HaveCoin(outp));
    BOOST_CHECK(view->HaveCoin(outp));

    if (do_erasing_flush) {
        // --- 4. Flushing the caches again (with erasing)
        //
        flush_all(/*erase=*/ true);

        // Memory does not necessarily go down due to the map using a memory pool
        BOOST_TEST(view->DynamicMemoryUsage() <= cache_usage);
        // Size of the cache must go down though
        BOOST_TEST(view->map().size() < cache_size);

        // --- 5. Ensuring the entry is no longer in the cache
        //
        GetCoinsMapEntry(view->map(), value, flags, outp);
        BOOST_CHECK_EQUAL(value, ABSENT);
        BOOST_CHECK_EQUAL(flags, NO_ENTRY);

        view->AccessCoin(outp);
        GetCoinsMapEntry(view->map(), value, flags, outp);
        BOOST_CHECK_EQUAL(value, coin.out.nValue);
        BOOST_CHECK_EQUAL(flags, 0);
    }

    // Can't overwrite an entry without specifying that an overwrite is
    // expected.
    BOOST_CHECK_THROW(
        view->AddCoin(outp, Coin(coin), /*possible_overwrite=*/ false),
        std::logic_error);

    // --- 6. Spend the coin.
    //
    BOOST_CHECK(view->SpendCoin(outp));

    // The coin should be in the cache, but spent and marked dirty.
    GetCoinsMapEntry(view->map(), value, flags, outp);
    BOOST_CHECK_EQUAL(value, SPENT);
    BOOST_CHECK_EQUAL(flags, DIRTY);
    BOOST_CHECK(!view->HaveCoin(outp)); // Coin should be considered spent in `view`.
    BOOST_CHECK(base.HaveCoin(outp));  // But coin should still be unspent in `base`.

    flush_all(/*erase=*/ false);

    // Coin should be considered spent in both views.
    BOOST_CHECK(!view->HaveCoin(outp));
    BOOST_CHECK(!base.HaveCoin(outp));

    // Spent coin should not be spendable.
    BOOST_CHECK(!view->SpendCoin(outp));

    // --- Bonus check: ensure that a coin added to the base view via one cache
    //     can be spent by another cache which has never seen it.
    //
    txid = Txid::FromUint256(m_rng.rand256());
    outp = COutPoint(txid, 0);
    coin = MakeCoin();
    BOOST_CHECK(!base.HaveCoin(outp));
    BOOST_CHECK(!all_caches[0]->HaveCoin(outp));
    BOOST_CHECK(!all_caches[1]->HaveCoin(outp));

    all_caches[0]->AddCoin(outp, std::move(coin), false);
    all_caches[0]->Sync();
    BOOST_CHECK(base.HaveCoin(outp));
    BOOST_CHECK(all_caches[0]->HaveCoin(outp));
    BOOST_CHECK(!all_caches[1]->HaveCoinInCache(outp));

    BOOST_CHECK(all_caches[1]->SpendCoin(outp));
    flush_all(/*erase=*/ false);
    BOOST_CHECK(!base.HaveCoin(outp));
    BOOST_CHECK(!all_caches[0]->HaveCoin(outp));
    BOOST_CHECK(!all_caches[1]->HaveCoin(outp));

    flush_all(/*erase=*/ true); // Erase all cache content.

    // --- Bonus check 2: ensure that a FRESH, spent coin is deleted by Sync()
    //
    txid = Txid::FromUint256(m_rng.rand256());
    outp = COutPoint(txid, 0);
    coin = MakeCoin();
    CAmount coin_val = coin.out.nValue;
    BOOST_CHECK(!base.HaveCoin(outp));
    BOOST_CHECK(!all_caches[0]->HaveCoin(outp));
    BOOST_CHECK(!all_caches[1]->HaveCoin(outp));

    // Add and spend from same cache without flushing.
    all_caches[0]->AddCoin(outp, std::move(coin), false);

    // Coin should be FRESH in the cache.
    GetCoinsMapEntry(all_caches[0]->map(), value, flags, outp);
    BOOST_CHECK_EQUAL(value, coin_val);
    BOOST_CHECK_EQUAL(flags, DIRTY|FRESH);

    // Base shouldn't have seen coin.
    BOOST_CHECK(!base.HaveCoin(outp));

    BOOST_CHECK(all_caches[0]->SpendCoin(outp));
    all_caches[0]->Sync();

    // Ensure there is no sign of the coin after spend/flush.
    GetCoinsMapEntry(all_caches[0]->map(), value, flags, outp);
    BOOST_CHECK_EQUAL(value, ABSENT);
    BOOST_CHECK_EQUAL(flags, NO_ENTRY);
    BOOST_CHECK(!all_caches[0]->HaveCoinInCache(outp));
    BOOST_CHECK(!base.HaveCoin(outp));
}